

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_os_environ(uv_env_item_t **envitems,int *count)

{
  long lVar1;
  int iVar2;
  uv_env_item_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  size_t __nmemb;
  size_t sVar7;
  
  *envitems = (uv_env_item_t *)0x0;
  *count = 0;
  __nmemb = 0xffffffffffffffff;
  do {
    lVar1 = __nmemb * 8;
    __nmemb = __nmemb + 1;
  } while (*(long *)(_environ + 8 + lVar1) != 0);
  puVar3 = (uv_env_item_t *)uv__calloc(__nmemb,0x10);
  *envitems = puVar3;
  if (puVar3 == (uv_env_item_t *)0x0) {
    iVar2 = -0xc;
  }
  else {
    sVar7 = 0;
    iVar6 = 0;
LAB_0060e6f8:
    if ((__nmemb == sVar7) || (pcVar4 = *(char **)(_environ + sVar7 * 8), pcVar4 == (char *)0x0)) {
      iVar2 = 0;
    }
    else {
      pcVar4 = uv__strdup(pcVar4);
      if (pcVar4 != (char *)0x0) goto code_r0x0060e71d;
      iVar2 = 0;
      if (0 < iVar6) {
        iVar2 = iVar6;
      }
      while( true ) {
        if (iVar2 == 0) break;
        uv__free((*envitems)[iVar6].name);
        iVar2 = iVar2 + -1;
      }
      uv__free(*envitems);
      *envitems = (uv_env_item_t *)0x0;
      iVar2 = -0xc;
      iVar6 = 0;
    }
    *count = iVar6;
  }
  return iVar2;
code_r0x0060e71d:
  pcVar5 = strchr(pcVar4,0x3d);
  if (pcVar5 == (char *)0x0) {
    uv__free(pcVar4);
  }
  else {
    *pcVar5 = '\0';
    puVar3 = *envitems;
    puVar3[iVar6].name = pcVar4;
    puVar3[iVar6].value = pcVar5 + 1;
    iVar6 = iVar6 + 1;
  }
  sVar7 = sVar7 + 1;
  goto LAB_0060e6f8;
}

Assistant:

int uv_os_environ(uv_env_item_t** envitems, int* count) {
  int i, j, cnt;
  uv_env_item_t* envitem;

  *envitems = NULL;
  *count = 0;

  for (i = 0; environ[i] != NULL; i++);

  *envitems = uv__calloc(i, sizeof(**envitems));

  if (*envitems == NULL)
    return UV_ENOMEM;

  for (j = 0, cnt = 0; j < i; j++) {
    char* buf;
    char* ptr;

    if (environ[j] == NULL)
      break;

    buf = uv__strdup(environ[j]);
    if (buf == NULL)
      goto fail;

    ptr = strchr(buf, '=');
    if (ptr == NULL) {
      uv__free(buf);
      continue;
    }

    *ptr = '\0';

    envitem = &(*envitems)[cnt];
    envitem->name = buf;
    envitem->value = ptr + 1;

    cnt++;
  }

  *count = cnt;
  return 0;

fail:
  for (i = 0; i < cnt; i++) {
    envitem = &(*envitems)[cnt];
    uv__free(envitem->name);
  }
  uv__free(*envitems);

  *envitems = NULL;
  *count = 0;
  return UV_ENOMEM;
}